

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.cxx
# Opt level: O0

void __thiscall xray_re::xr_memory_writer::xr_memory_writer(xr_memory_writer *this)

{
  xr_memory_writer *this_local;
  
  xr_writer::xr_writer(&this->super_xr_writer);
  (this->super_xr_writer)._vptr_xr_writer = (_func_int **)&PTR__xr_memory_writer_0038e300;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->m_buffer);
  this->m_pos = 0;
  return;
}

Assistant:

xr_memory_writer::xr_memory_writer(): m_pos(0) {}